

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to1.h
# Opt level: O1

void ncnn::im2col_sgemm_pack4to1_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  int *piVar67;
  float *pfVar68;
  uint uVar69;
  long lVar70;
  float *pfVar71;
  int iVar72;
  uint uVar73;
  long lVar74;
  float *pfVar75;
  ulong uVar76;
  float *pfVar77;
  undefined4 *puVar78;
  float *pfVar79;
  int iVar80;
  int iVar81;
  ulong uVar82;
  uint uVar83;
  undefined4 *puVar84;
  float *pfVar85;
  float *pfVar86;
  uint uVar87;
  int iVar88;
  float *pfVar89;
  float *pfVar90;
  long lVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  int nn_1;
  int nn;
  float zeros [4];
  Mat local_f8;
  ulong local_a8;
  ulong local_a0;
  void *local_98;
  long local_90;
  uint local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Mat *local_50;
  float local_48 [4];
  ulong local_38;
  
  uVar3 = bottom_im2col->w;
  iVar4 = bottom_im2col->h;
  local_a8 = (ulong)(uint)bottom_im2col->c;
  local_90 = (long)top_blob->c;
  local_98 = _bias->data;
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  if ((long)(int)uVar3 < 0xc) {
    if ((int)uVar3 < 8) {
      uVar69 = uVar3;
      iVar88 = iVar4;
      if (3 < (int)uVar3) {
        iVar88 = iVar4 * 4;
        uVar69 = (uVar3 & 3) + 1;
      }
    }
    else {
      uVar69 = (uVar3 & 3) + 1 + (uint)((uVar3 >> 2 & 1) != 0);
      iVar88 = iVar4 * 8;
    }
  }
  else {
    uVar69 = uVar3 % 0xc;
    uVar69 = (uVar69 & 3) + (uVar69 >> 3) + uVar3 / 0xc + (uint)((uVar69 >> 2 & 1) != 0);
    iVar88 = iVar4 * 0xc;
  }
  local_50 = top_blob;
  Mat::create(&local_f8,iVar88,bottom_im2col->c,uVar69,0x10,4,opt->workspace_allocator);
  if (0xb < (int)uVar3) {
    uVar76 = 0;
    do {
      if (0 < (int)local_a8) {
        puVar78 = (undefined4 *)
                  (local_f8.cstep * uVar76 *
                   CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                  (long)local_f8.data);
        uVar82 = 0;
        do {
          if (0 < iVar4) {
            puVar84 = (undefined4 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar82 +
                      ((long)((uVar76 << 0x24) * 3) >> 0x1e) + 0xb0);
            iVar88 = iVar4;
            do {
              uVar8 = puVar84[-0x2b];
              uVar9 = puVar84[-0x2a];
              uVar10 = puVar84[-0x29];
              uVar11 = puVar84[-0x28];
              uVar12 = puVar84[-0x27];
              uVar13 = puVar84[-0x26];
              uVar14 = puVar84[-0x25];
              uVar15 = puVar84[-0x24];
              uVar16 = puVar84[-0x23];
              uVar17 = puVar84[-0x22];
              uVar18 = puVar84[-0x21];
              uVar19 = puVar84[-0x20];
              uVar20 = puVar84[-0x1f];
              uVar21 = puVar84[-0x1e];
              uVar22 = puVar84[-0x1d];
              uVar23 = puVar84[-0x1c];
              uVar24 = puVar84[-0x1b];
              uVar25 = puVar84[-0x1a];
              uVar26 = puVar84[-0x19];
              uVar27 = puVar84[-0x18];
              uVar28 = puVar84[-0x17];
              uVar29 = puVar84[-0x16];
              uVar30 = puVar84[-0x15];
              uVar31 = puVar84[-0x14];
              uVar32 = puVar84[-0x13];
              uVar33 = puVar84[-0x12];
              uVar34 = puVar84[-0x11];
              uVar35 = puVar84[-0x10];
              uVar36 = puVar84[-0xf];
              uVar37 = puVar84[-0xe];
              uVar38 = puVar84[-0xd];
              uVar39 = puVar84[-0xc];
              uVar40 = puVar84[-0xb];
              uVar41 = puVar84[-10];
              uVar42 = puVar84[-9];
              uVar43 = puVar84[-8];
              uVar44 = puVar84[-7];
              uVar45 = puVar84[-6];
              uVar46 = puVar84[-5];
              uVar47 = puVar84[-4];
              uVar48 = puVar84[-3];
              uVar49 = puVar84[-2];
              uVar50 = puVar84[-1];
              uVar51 = *puVar84;
              uVar52 = puVar84[1];
              uVar53 = puVar84[2];
              uVar54 = puVar84[3];
              *puVar78 = puVar84[-0x2c];
              puVar78[1] = uVar11;
              puVar78[2] = uVar15;
              puVar78[3] = uVar19;
              puVar78[4] = uVar23;
              puVar78[5] = uVar27;
              puVar78[6] = uVar31;
              puVar78[7] = uVar35;
              puVar78[8] = uVar39;
              puVar78[9] = uVar43;
              puVar78[10] = uVar47;
              puVar78[0xb] = uVar51;
              puVar78[0xc] = uVar8;
              puVar78[0xd] = uVar12;
              puVar78[0xe] = uVar16;
              puVar78[0xf] = uVar20;
              puVar78[0x10] = uVar24;
              puVar78[0x11] = uVar28;
              puVar78[0x12] = uVar32;
              puVar78[0x13] = uVar36;
              puVar78[0x14] = uVar40;
              puVar78[0x15] = uVar44;
              puVar78[0x16] = uVar48;
              puVar78[0x17] = uVar52;
              puVar78[0x18] = uVar9;
              puVar78[0x19] = uVar13;
              puVar78[0x1a] = uVar17;
              puVar78[0x1b] = uVar21;
              puVar78[0x1c] = uVar25;
              puVar78[0x1d] = uVar29;
              puVar78[0x1e] = uVar33;
              puVar78[0x1f] = uVar37;
              puVar78[0x20] = uVar41;
              puVar78[0x21] = uVar45;
              puVar78[0x22] = uVar49;
              puVar78[0x23] = uVar53;
              puVar78[0x24] = uVar10;
              puVar78[0x25] = uVar14;
              puVar78[0x26] = uVar18;
              puVar78[0x27] = uVar22;
              puVar78[0x28] = uVar26;
              puVar78[0x29] = uVar30;
              puVar78[0x2a] = uVar34;
              puVar78[0x2b] = uVar38;
              puVar78[0x2c] = uVar42;
              puVar78[0x2d] = uVar46;
              puVar78[0x2e] = uVar50;
              puVar78[0x2f] = uVar54;
              puVar78 = puVar78 + 0x30;
              puVar84 = puVar84 + uVar3 * 4;
              iVar88 = iVar88 + -1;
            } while (iVar88 != 0);
          }
          uVar82 = uVar82 + 1;
        } while (uVar82 != local_a8);
      }
      uVar76 = uVar76 + 1;
    } while (uVar76 != (uint)((int)uVar3 / 0xc));
  }
  iVar88 = ((int)uVar3 / 0xc) * 0xc;
  uVar69 = (int)uVar3 % 0xc >> 3;
  if (0 < (int)uVar69) {
    lVar74 = (long)iVar88 * 0x10 + 0x40;
    uVar76 = 0;
    do {
      if (0 < (int)local_a8) {
        iVar80 = iVar88 + (int)uVar76 * 8;
        iVar81 = iVar80 % 0xc;
        iVar72 = iVar81 + 7;
        if (-1 < iVar81) {
          iVar72 = iVar81;
        }
        puVar78 = (undefined4 *)
                  ((long)((iVar72 >> 3) + iVar80 / 0xc) * local_f8.cstep *
                   CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                  (long)local_f8.data);
        uVar82 = 0;
        do {
          if (0 < iVar4) {
            puVar84 = (undefined4 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar82 + lVar74);
            iVar72 = iVar4;
            do {
              uVar8 = puVar84[-0xf];
              uVar9 = puVar84[-0xe];
              uVar10 = puVar84[-0xd];
              uVar11 = puVar84[-0xc];
              uVar12 = puVar84[-0xb];
              uVar13 = puVar84[-10];
              uVar14 = puVar84[-9];
              uVar15 = puVar84[-8];
              uVar16 = puVar84[-7];
              uVar17 = puVar84[-6];
              uVar18 = puVar84[-5];
              uVar19 = puVar84[-4];
              uVar20 = puVar84[-3];
              uVar21 = puVar84[-2];
              uVar22 = puVar84[-1];
              uVar23 = *puVar84;
              uVar24 = puVar84[1];
              uVar25 = puVar84[2];
              uVar26 = puVar84[3];
              uVar27 = puVar84[4];
              uVar28 = puVar84[5];
              uVar29 = puVar84[6];
              uVar30 = puVar84[7];
              uVar31 = puVar84[8];
              uVar32 = puVar84[9];
              uVar33 = puVar84[10];
              uVar34 = puVar84[0xb];
              uVar35 = puVar84[0xc];
              uVar36 = puVar84[0xd];
              uVar37 = puVar84[0xe];
              uVar38 = puVar84[0xf];
              *puVar78 = puVar84[-0x10];
              puVar78[1] = uVar11;
              puVar78[2] = uVar15;
              puVar78[3] = uVar19;
              puVar78[4] = uVar23;
              puVar78[5] = uVar27;
              puVar78[6] = uVar31;
              puVar78[7] = uVar35;
              puVar78[8] = uVar8;
              puVar78[9] = uVar12;
              puVar78[10] = uVar16;
              puVar78[0xb] = uVar20;
              puVar78[0xc] = uVar24;
              puVar78[0xd] = uVar28;
              puVar78[0xe] = uVar32;
              puVar78[0xf] = uVar36;
              puVar78[0x10] = uVar9;
              puVar78[0x11] = uVar13;
              puVar78[0x12] = uVar17;
              puVar78[0x13] = uVar21;
              puVar78[0x14] = uVar25;
              puVar78[0x15] = uVar29;
              puVar78[0x16] = uVar33;
              puVar78[0x17] = uVar37;
              puVar78[0x18] = uVar10;
              puVar78[0x19] = uVar14;
              puVar78[0x1a] = uVar18;
              puVar78[0x1b] = uVar22;
              puVar78[0x1c] = uVar26;
              puVar78[0x1d] = uVar30;
              puVar78[0x1e] = uVar34;
              puVar78[0x1f] = uVar38;
              puVar78 = puVar78 + 0x20;
              puVar84 = puVar84 + (int)(uVar3 * 4);
              iVar72 = iVar72 + -1;
            } while (iVar72 != 0);
          }
          uVar82 = uVar82 + 1;
        } while (uVar82 != local_a8);
      }
      uVar76 = uVar76 + 1;
      lVar74 = lVar74 + 0x80;
    } while (uVar76 != uVar69);
  }
  iVar88 = ((int)uVar3 % 0xc & 0xfffffff8U) + iVar88;
  uVar69 = (int)(uVar3 - iVar88) >> 2;
  if (0 < (int)uVar69) {
    lVar74 = (long)iVar88 * 0x10 + 0x30;
    uVar76 = 0;
    do {
      if (0 < (int)local_a8) {
        iVar80 = iVar88 + (int)uVar76 * 4;
        iVar81 = iVar80 % 0xc;
        iVar72 = iVar81 + 7;
        if (-1 < iVar81) {
          iVar72 = iVar81;
        }
        puVar78 = (undefined4 *)
                  ((long)((iVar81 % 8 >> 2) + (iVar72 >> 3) + iVar80 / 0xc) * local_f8.cstep *
                   CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                  (long)local_f8.data);
        uVar82 = 0;
        do {
          if (0 < iVar4) {
            puVar84 = (undefined4 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar82 + lVar74);
            iVar72 = iVar4;
            do {
              uVar8 = puVar84[-0xb];
              uVar9 = puVar84[-10];
              uVar10 = puVar84[-9];
              uVar11 = puVar84[-8];
              uVar12 = puVar84[-7];
              uVar13 = puVar84[-6];
              uVar14 = puVar84[-5];
              uVar15 = puVar84[-4];
              uVar16 = puVar84[-3];
              uVar17 = puVar84[-2];
              uVar18 = puVar84[-1];
              uVar19 = *puVar84;
              uVar20 = puVar84[1];
              uVar21 = puVar84[2];
              uVar22 = puVar84[3];
              *puVar78 = puVar84[-0xc];
              puVar78[1] = uVar11;
              puVar78[2] = uVar15;
              puVar78[3] = uVar19;
              puVar78[4] = uVar8;
              puVar78[5] = uVar12;
              puVar78[6] = uVar16;
              puVar78[7] = uVar20;
              puVar78[8] = uVar9;
              puVar78[9] = uVar13;
              puVar78[10] = uVar17;
              puVar78[0xb] = uVar21;
              puVar78[0xc] = uVar10;
              puVar78[0xd] = uVar14;
              puVar78[0xe] = uVar18;
              puVar78[0xf] = uVar22;
              puVar78 = puVar78 + 0x10;
              puVar84 = puVar84 + (int)(uVar3 * 4);
              iVar72 = iVar72 + -1;
            } while (iVar72 != 0);
          }
          uVar82 = uVar82 + 1;
        } while (uVar82 != local_a8);
      }
      uVar76 = uVar76 + 1;
      lVar74 = lVar74 + 0x40;
    } while (uVar76 != uVar69);
  }
  iVar88 = (uVar3 - iVar88 & 0xfffffffc) + iVar88;
  if (iVar88 < (int)uVar3) {
    lVar74 = (long)iVar88;
    lVar70 = lVar74 << 4;
    do {
      if (0 < (int)local_a8) {
        iVar72 = (int)lVar74 % 0xc;
        iVar88 = iVar72 + 7;
        if (-1 < iVar72) {
          iVar88 = iVar72;
        }
        iVar80 = iVar72 % 8 + 3;
        if (-1 < iVar72 % 8) {
          iVar80 = iVar72 % 8;
        }
        puVar78 = (undefined4 *)
                  ((long)((iVar80 >> 2) + iVar72 % 4 + (iVar88 >> 3) + (int)lVar74 / 0xc) *
                   local_f8.cstep * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize)
                  + (long)local_f8.data);
        uVar76 = 0;
        do {
          if (0 < iVar4) {
            puVar84 = (undefined4 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar76 + lVar70);
            iVar88 = iVar4;
            do {
              uVar8 = puVar84[1];
              uVar9 = puVar84[2];
              uVar10 = puVar84[3];
              *puVar78 = *puVar84;
              puVar78[1] = uVar8;
              puVar78[2] = uVar9;
              puVar78[3] = uVar10;
              puVar78 = puVar78 + 4;
              puVar84 = puVar84 + (int)(uVar3 * 4);
              iVar88 = iVar88 + -1;
            } while (iVar88 != 0);
          }
          uVar76 = uVar76 + 1;
        } while (uVar76 != local_a8);
      }
      lVar74 = lVar74 + 1;
      lVar70 = lVar70 + 0x10;
    } while (lVar74 < (int)uVar3);
  }
  uVar69 = (uint)local_90;
  uVar87 = uVar69 + 3;
  if (-1 < (int)uVar69) {
    uVar87 = uVar69;
  }
  local_88 = uVar87 & 0xfffffffc;
  if (3 < (int)uVar69) {
    iVar88 = (int)local_a8 * iVar4 * 4;
    local_80 = (int)local_a8 * iVar4 * 4;
    local_84 = (int)local_a8 * iVar4 * 4;
    local_7c = (int)local_a8 * iVar4 * 4;
    local_38 = (ulong)(uint)((int)uVar87 >> 2);
    uVar76 = 0;
    do {
      local_a0 = uVar76;
      sVar5 = local_50->cstep;
      pvVar6 = local_50->data;
      sVar7 = local_50->elemsize;
      pfVar89 = (float *)(local_a0 * 4 * sVar5 * sVar7 + (long)pvVar6);
      pfVar85 = (float *)((local_a0 * 4 + 1) * sVar5 * sVar7 + (long)pvVar6);
      pfVar77 = (float *)((local_a0 * 4 + 2) * sVar5 * sVar7 + (long)pvVar6);
      pfVar79 = (float *)((local_a0 * 4 + 3) * sVar5 * sVar7 + (long)pvVar6);
      pfVar75 = (float *)(local_a0 * 0x10 + (long)local_98);
      pfVar86 = pfVar75;
      if (local_98 == (void *)0x0) {
        pfVar86 = local_48;
      }
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      local_48[3] = 0.0;
      if ((int)uVar3 < 0xc) {
        uVar76 = 0;
      }
      else {
        pfVar68 = pfVar75;
        if (local_98 == (void *)0x0) {
          pfVar68 = local_48;
        }
        uVar82 = 0;
        do {
          fVar100 = *pfVar86;
          fVar116 = pfVar68[1];
          fVar92 = pfVar68[2];
          fVar96 = pfVar68[3];
          fVar97 = fVar96;
          fVar98 = fVar96;
          fVar99 = fVar96;
          fVar93 = fVar92;
          fVar94 = fVar92;
          fVar95 = fVar92;
          fVar101 = fVar100;
          fVar102 = fVar100;
          fVar103 = fVar100;
          fVar104 = fVar96;
          fVar105 = fVar96;
          fVar106 = fVar96;
          fVar107 = fVar96;
          fVar108 = fVar96;
          fVar109 = fVar96;
          fVar110 = fVar96;
          fVar111 = fVar96;
          fVar112 = fVar92;
          fVar113 = fVar92;
          fVar114 = fVar92;
          fVar115 = fVar92;
          fVar117 = fVar116;
          fVar118 = fVar116;
          fVar119 = fVar116;
          fVar120 = fVar116;
          fVar121 = fVar116;
          fVar122 = fVar116;
          fVar123 = fVar116;
          fVar124 = fVar100;
          fVar125 = fVar100;
          fVar126 = fVar100;
          fVar127 = fVar100;
          fVar128 = fVar100;
          fVar129 = fVar100;
          fVar130 = fVar100;
          fVar131 = fVar100;
          fStack_70 = fVar92;
          fStack_6c = fVar92;
          local_68 = fVar116;
          fStack_64 = fVar116;
          fStack_60 = fVar116;
          fStack_5c = fVar116;
          if ((int)local_a8 * iVar4 * 4 < 1) {
            local_78 = CONCAT44(fVar92,fVar92);
          }
          else {
            pfVar90 = (float *)(kernel->cstep * local_a0 * kernel->elemsize + (long)kernel->data);
            pfVar71 = (float *)((uVar82 / 0xc) * local_f8.cstep *
                                CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                               (long)local_f8.data);
            local_78 = CONCAT44(fVar92,fVar92);
            iVar72 = iVar88;
            do {
              fVar55 = *pfVar71;
              fVar56 = pfVar71[1];
              fVar57 = pfVar71[2];
              fVar58 = pfVar71[3];
              fVar59 = pfVar71[4];
              fVar60 = pfVar71[5];
              fVar61 = pfVar71[6];
              fVar62 = pfVar71[7];
              fVar63 = pfVar71[8];
              fVar64 = pfVar71[9];
              fVar65 = pfVar71[10];
              fVar66 = pfVar71[0xb];
              fVar1 = *pfVar90;
              fVar100 = fVar100 + fVar1 * fVar55;
              fVar101 = fVar101 + fVar1 * fVar56;
              fVar102 = fVar102 + fVar1 * fVar57;
              fVar103 = fVar103 + fVar1 * fVar58;
              fVar128 = fVar128 + fVar1 * fVar59;
              fVar129 = fVar129 + fVar1 * fVar60;
              fVar130 = fVar130 + fVar1 * fVar61;
              fVar131 = fVar131 + fVar1 * fVar62;
              fVar2 = pfVar90[1];
              fVar124 = fVar124 + fVar1 * fVar63;
              fVar125 = fVar125 + fVar1 * fVar64;
              fVar126 = fVar126 + fVar1 * fVar65;
              fVar127 = fVar127 + fVar1 * fVar66;
              local_68 = local_68 + fVar2 * fVar55;
              fStack_64 = fStack_64 + fVar2 * fVar56;
              fStack_60 = fStack_60 + fVar2 * fVar57;
              fStack_5c = fStack_5c + fVar2 * fVar58;
              fVar120 = fVar120 + fVar2 * fVar59;
              fVar121 = fVar121 + fVar2 * fVar60;
              fVar122 = fVar122 + fVar2 * fVar61;
              fVar123 = fVar123 + fVar2 * fVar62;
              fVar1 = pfVar90[2];
              fVar116 = fVar116 + fVar2 * fVar63;
              fVar117 = fVar117 + fVar2 * fVar64;
              fVar118 = fVar118 + fVar2 * fVar65;
              fVar119 = fVar119 + fVar2 * fVar66;
              fVar112 = fVar112 + fVar1 * fVar55;
              fVar113 = fVar113 + fVar1 * fVar56;
              fVar114 = fVar114 + fVar1 * fVar57;
              fVar115 = fVar115 + fVar1 * fVar58;
              fStack_70 = fStack_70 + fVar1 * fVar61;
              fStack_6c = fStack_6c + fVar1 * fVar62;
              local_78 = CONCAT44(local_78._4_4_ + fVar1 * fVar60,(float)local_78 + fVar1 * fVar59);
              fVar92 = fVar92 + fVar1 * fVar63;
              fVar93 = fVar93 + fVar1 * fVar64;
              fVar94 = fVar94 + fVar1 * fVar65;
              fVar95 = fVar95 + fVar1 * fVar66;
              fVar1 = pfVar90[3];
              fVar108 = fVar108 + fVar55 * fVar1;
              fVar109 = fVar109 + fVar56 * fVar1;
              fVar110 = fVar110 + fVar57 * fVar1;
              fVar111 = fVar111 + fVar58 * fVar1;
              fVar104 = fVar104 + fVar59 * fVar1;
              fVar105 = fVar105 + fVar60 * fVar1;
              fVar106 = fVar106 + fVar61 * fVar1;
              fVar107 = fVar107 + fVar62 * fVar1;
              fVar96 = fVar96 + fVar1 * fVar63;
              fVar97 = fVar97 + fVar1 * fVar64;
              fVar98 = fVar98 + fVar1 * fVar65;
              fVar99 = fVar99 + fVar1 * fVar66;
              pfVar71 = pfVar71 + 0xc;
              pfVar90 = pfVar90 + 4;
              iVar72 = iVar72 + -1;
            } while (iVar72 != 0);
          }
          *pfVar89 = fVar100;
          pfVar89[1] = fVar101;
          pfVar89[2] = fVar102;
          pfVar89[3] = fVar103;
          pfVar89[4] = fVar128;
          pfVar89[5] = fVar129;
          pfVar89[6] = fVar130;
          pfVar89[7] = fVar131;
          pfVar89[8] = fVar124;
          pfVar89[9] = fVar125;
          pfVar89[10] = fVar126;
          pfVar89[0xb] = fVar127;
          *(ulong *)pfVar85 = CONCAT44(fStack_64,local_68);
          *(ulong *)(pfVar85 + 2) = CONCAT44(fStack_5c,fStack_60);
          pfVar85[4] = fVar120;
          pfVar85[5] = fVar121;
          pfVar85[6] = fVar122;
          pfVar85[7] = fVar123;
          pfVar85[8] = fVar116;
          pfVar85[9] = fVar117;
          pfVar85[10] = fVar118;
          pfVar85[0xb] = fVar119;
          *pfVar77 = fVar112;
          pfVar77[1] = fVar113;
          pfVar77[2] = fVar114;
          pfVar77[3] = fVar115;
          *(ulong *)(pfVar77 + 4) = local_78;
          *(ulong *)(pfVar77 + 6) = CONCAT44(fStack_6c,fStack_70);
          pfVar77[8] = fVar92;
          pfVar77[9] = fVar93;
          pfVar77[10] = fVar94;
          pfVar77[0xb] = fVar95;
          *pfVar79 = fVar108;
          pfVar79[1] = fVar109;
          pfVar79[2] = fVar110;
          pfVar79[3] = fVar111;
          pfVar79[4] = fVar104;
          pfVar79[5] = fVar105;
          pfVar79[6] = fVar106;
          pfVar79[7] = fVar107;
          pfVar79[8] = fVar96;
          pfVar79[9] = fVar97;
          pfVar79[10] = fVar98;
          pfVar79[0xb] = fVar99;
          pfVar89 = pfVar89 + 0xc;
          pfVar85 = pfVar85 + 0xc;
          pfVar77 = pfVar77 + 0xc;
          pfVar79 = pfVar79 + 0xc;
          uVar76 = uVar82 + 0xc;
          iVar72 = (int)uVar82;
          uVar82 = uVar76;
        } while (iVar72 + 0x17 < (int)uVar3);
      }
      if ((int)uVar76 + 7 < (int)uVar3) {
        pfVar68 = pfVar75;
        if (local_98 == (void *)0x0) {
          pfVar68 = local_48;
        }
        do {
          fVar100 = *pfVar86;
          fVar116 = pfVar68[1];
          fVar92 = pfVar68[2];
          fVar96 = pfVar68[3];
          iVar72 = (int)uVar76;
          fVar97 = fVar100;
          fVar98 = fVar100;
          fVar99 = fVar100;
          fVar93 = fVar116;
          fVar94 = fVar116;
          fVar95 = fVar116;
          fVar101 = fVar92;
          fVar102 = fVar92;
          fVar103 = fVar92;
          fVar104 = fVar96;
          fVar105 = fVar96;
          fVar106 = fVar96;
          fVar107 = fVar96;
          fVar108 = fVar96;
          fVar109 = fVar96;
          fVar110 = fVar96;
          fVar111 = fVar92;
          fVar112 = fVar92;
          fVar113 = fVar92;
          fVar114 = fVar92;
          fVar115 = fVar116;
          fVar117 = fVar116;
          fVar118 = fVar116;
          fVar119 = fVar116;
          fVar120 = fVar100;
          fVar121 = fVar100;
          fVar122 = fVar100;
          fVar123 = fVar100;
          if (0 < local_80) {
            lVar74 = kernel->cstep * local_a0 * kernel->elemsize;
            pvVar6 = kernel->data;
            lVar91 = local_f8.cstep *
                     CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) *
                     (ulong)(((uint)(iVar72 + (int)((uVar76 & 0xffffffff) / 0xc) * -0xc) >> 3) +
                            (int)((uVar76 & 0xffffffff) / 0xc));
            lVar70 = 0;
            iVar80 = iVar88;
            do {
              pfVar71 = (float *)((long)local_f8.data + lVar70 * 2 + lVar91);
              fVar128 = *pfVar71;
              fVar129 = pfVar71[1];
              fVar130 = pfVar71[2];
              fVar131 = pfVar71[3];
              pfVar71 = (float *)((long)local_f8.data + lVar70 * 2 + lVar91 + 0x10);
              fVar1 = *pfVar71;
              fVar2 = pfVar71[1];
              fVar55 = pfVar71[2];
              fVar56 = pfVar71[3];
              fVar124 = *(float *)((long)pvVar6 + lVar70 + lVar74);
              fVar125 = *(float *)((long)pvVar6 + lVar70 + lVar74 + 4);
              fVar126 = *(float *)((long)pvVar6 + lVar70 + lVar74 + 8);
              fVar127 = *(float *)((long)pvVar6 + lVar70 + lVar74 + 0xc);
              fVar120 = fVar120 + fVar124 * fVar128;
              fVar121 = fVar121 + fVar124 * fVar129;
              fVar122 = fVar122 + fVar124 * fVar130;
              fVar123 = fVar123 + fVar124 * fVar131;
              fVar100 = fVar100 + fVar124 * fVar1;
              fVar97 = fVar97 + fVar124 * fVar2;
              fVar98 = fVar98 + fVar124 * fVar55;
              fVar99 = fVar99 + fVar124 * fVar56;
              fVar115 = fVar115 + fVar125 * fVar128;
              fVar117 = fVar117 + fVar125 * fVar129;
              fVar118 = fVar118 + fVar125 * fVar130;
              fVar119 = fVar119 + fVar125 * fVar131;
              fVar116 = fVar116 + fVar125 * fVar1;
              fVar93 = fVar93 + fVar125 * fVar2;
              fVar94 = fVar94 + fVar125 * fVar55;
              fVar95 = fVar95 + fVar125 * fVar56;
              fVar111 = fVar111 + fVar126 * fVar128;
              fVar112 = fVar112 + fVar126 * fVar129;
              fVar113 = fVar113 + fVar126 * fVar130;
              fVar114 = fVar114 + fVar126 * fVar131;
              fVar92 = fVar92 + fVar126 * fVar1;
              fVar101 = fVar101 + fVar126 * fVar2;
              fVar102 = fVar102 + fVar126 * fVar55;
              fVar103 = fVar103 + fVar126 * fVar56;
              fVar107 = fVar107 + fVar128 * fVar127;
              fVar108 = fVar108 + fVar129 * fVar127;
              fVar109 = fVar109 + fVar130 * fVar127;
              fVar110 = fVar110 + fVar131 * fVar127;
              fVar96 = fVar96 + fVar127 * fVar1;
              fVar104 = fVar104 + fVar127 * fVar2;
              fVar105 = fVar105 + fVar127 * fVar55;
              fVar106 = fVar106 + fVar127 * fVar56;
              lVar70 = lVar70 + 0x10;
              iVar80 = iVar80 + -1;
            } while (iVar80 != 0);
          }
          *pfVar89 = fVar120;
          pfVar89[1] = fVar121;
          pfVar89[2] = fVar122;
          pfVar89[3] = fVar123;
          pfVar89[4] = fVar100;
          pfVar89[5] = fVar97;
          pfVar89[6] = fVar98;
          pfVar89[7] = fVar99;
          *pfVar85 = fVar115;
          pfVar85[1] = fVar117;
          pfVar85[2] = fVar118;
          pfVar85[3] = fVar119;
          pfVar85[4] = fVar116;
          pfVar85[5] = fVar93;
          pfVar85[6] = fVar94;
          pfVar85[7] = fVar95;
          *pfVar77 = fVar111;
          pfVar77[1] = fVar112;
          pfVar77[2] = fVar113;
          pfVar77[3] = fVar114;
          pfVar77[4] = fVar92;
          pfVar77[5] = fVar101;
          pfVar77[6] = fVar102;
          pfVar77[7] = fVar103;
          *pfVar79 = fVar107;
          pfVar79[1] = fVar108;
          pfVar79[2] = fVar109;
          pfVar79[3] = fVar110;
          pfVar79[4] = fVar96;
          pfVar79[5] = fVar104;
          pfVar79[6] = fVar105;
          pfVar79[7] = fVar106;
          pfVar89 = pfVar89 + 8;
          pfVar85 = pfVar85 + 8;
          pfVar77 = pfVar77 + 8;
          pfVar79 = pfVar79 + 8;
          uVar76 = (ulong)(iVar72 + 8);
        } while (iVar72 + 0xf < (int)uVar3);
      }
      else {
        uVar76 = uVar76 & 0xffffffff;
      }
      uVar73 = (uint)uVar76;
      if ((int)(uVar73 | 3) < (int)uVar3) {
        if (local_98 == (void *)0x0) {
          pfVar75 = local_48;
        }
        do {
          iVar72 = (int)uVar76;
          uVar73 = iVar72 + (int)(uVar76 / 0xc) * -0xc;
          fVar100 = *pfVar86;
          fVar116 = pfVar75[1];
          fVar92 = pfVar75[2];
          fVar96 = pfVar75[3];
          fVar97 = fVar100;
          fVar98 = fVar100;
          fVar99 = fVar100;
          fVar93 = fVar116;
          fVar94 = fVar116;
          fVar95 = fVar116;
          fVar101 = fVar92;
          fVar102 = fVar92;
          fVar103 = fVar92;
          fVar104 = fVar96;
          fVar105 = fVar96;
          fVar106 = fVar96;
          if (0 < local_84) {
            lVar74 = kernel->cstep * local_a0 * kernel->elemsize;
            pvVar6 = kernel->data;
            lVar70 = 0;
            iVar80 = iVar88;
            do {
              pfVar68 = (float *)((long)local_f8.data +
                                 lVar70 + local_f8.cstep *
                                          CONCAT44(local_f8.elemsize._4_4_,
                                                   (undefined4)local_f8.elemsize) *
                                          (ulong)((uVar73 >> 3) + (int)(uVar76 / 0xc) +
                                                 (uint)((uVar73 >> 2 & 1) != 0)));
              fVar111 = *pfVar68;
              fVar112 = pfVar68[1];
              fVar113 = pfVar68[2];
              fVar114 = pfVar68[3];
              fVar107 = *(float *)((long)pvVar6 + lVar70 + lVar74);
              fVar108 = *(float *)((long)pvVar6 + lVar70 + lVar74 + 4);
              fVar109 = *(float *)((long)pvVar6 + lVar70 + lVar74 + 8);
              fVar110 = *(float *)((long)pvVar6 + lVar70 + lVar74 + 0xc);
              fVar100 = fVar100 + fVar107 * fVar111;
              fVar97 = fVar97 + fVar107 * fVar112;
              fVar98 = fVar98 + fVar107 * fVar113;
              fVar99 = fVar99 + fVar107 * fVar114;
              fVar116 = fVar116 + fVar108 * fVar111;
              fVar93 = fVar93 + fVar108 * fVar112;
              fVar94 = fVar94 + fVar108 * fVar113;
              fVar95 = fVar95 + fVar108 * fVar114;
              fVar92 = fVar92 + fVar109 * fVar111;
              fVar101 = fVar101 + fVar109 * fVar112;
              fVar102 = fVar102 + fVar109 * fVar113;
              fVar103 = fVar103 + fVar109 * fVar114;
              fVar96 = fVar96 + fVar110 * fVar111;
              fVar104 = fVar104 + fVar110 * fVar112;
              fVar105 = fVar105 + fVar110 * fVar113;
              fVar106 = fVar106 + fVar110 * fVar114;
              lVar70 = lVar70 + 0x10;
              iVar80 = iVar80 + -1;
            } while (iVar80 != 0);
          }
          *pfVar89 = fVar100;
          pfVar89[1] = fVar97;
          pfVar89[2] = fVar98;
          pfVar89[3] = fVar99;
          *pfVar85 = fVar116;
          pfVar85[1] = fVar93;
          pfVar85[2] = fVar94;
          pfVar85[3] = fVar95;
          *pfVar77 = fVar92;
          pfVar77[1] = fVar101;
          pfVar77[2] = fVar102;
          pfVar77[3] = fVar103;
          *pfVar79 = fVar96;
          pfVar79[1] = fVar104;
          pfVar79[2] = fVar105;
          pfVar79[3] = fVar106;
          pfVar89 = pfVar89 + 4;
          pfVar85 = pfVar85 + 4;
          pfVar77 = pfVar77 + 4;
          pfVar79 = pfVar79 + 4;
          uVar73 = iVar72 + 4;
          uVar76 = (ulong)uVar73;
        } while (iVar72 + 7 < (int)uVar3);
      }
      if ((int)uVar73 < (int)uVar3) {
        sVar5 = kernel->cstep;
        sVar7 = kernel->elemsize;
        pvVar6 = kernel->data;
        do {
          fVar100 = *pfVar86;
          fVar116 = pfVar86[1];
          fVar92 = pfVar86[2];
          fVar96 = pfVar86[3];
          if (0 < local_7c) {
            lVar74 = 0;
            pfVar75 = (float *)(sVar5 * local_a0 * sVar7 + (long)pvVar6);
            do {
              fVar97 = *(float *)((long)local_f8.data +
                                 lVar74 * 4 +
                                 (ulong)((uVar73 & 3) + (uVar73 % 0xc >> 3) + uVar73 / 0xc +
                                        (uint)((uVar73 % 0xc >> 2 & 1) != 0)) *
                                 local_f8.cstep *
                                 CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
              fVar100 = fVar100 + fVar97 * *pfVar75;
              fVar116 = fVar116 + fVar97 * pfVar75[1];
              fVar92 = fVar92 + fVar97 * pfVar75[2];
              fVar96 = fVar96 + fVar97 * pfVar75[3];
              pfVar75 = pfVar75 + 4;
              lVar74 = lVar74 + 1;
            } while (iVar88 != (int)lVar74);
          }
          *pfVar89 = fVar100;
          *pfVar85 = fVar116;
          *pfVar77 = fVar92;
          *pfVar79 = fVar96;
          pfVar89 = pfVar89 + 1;
          pfVar85 = pfVar85 + 1;
          pfVar77 = pfVar77 + 1;
          pfVar79 = pfVar79 + 1;
          uVar73 = uVar73 + 1;
        } while (uVar73 != uVar3);
      }
      uVar76 = local_a0 + 1;
    } while (local_a0 + 1 != (ulong)(uint)((int)uVar87 >> 2));
  }
  if ((int)local_88 < (int)uVar69) {
    local_78 = (ulong)(uint)((int)local_a8 * iVar4);
    iVar88 = (int)local_a8 * iVar4 * 4;
    local_68 = (float)((int)local_a8 * iVar4 * 4);
    lVar74 = (long)(int)local_88;
    do {
      if (local_98 == (void *)0x0) {
        fVar100 = 0.0;
      }
      else {
        fVar100 = *(float *)((long)local_98 + lVar74 * 4);
      }
      pfVar86 = (float *)(local_50->cstep * lVar74 * local_50->elemsize + (long)local_50->data);
      uVar76 = 0;
      uVar69 = (uint)lVar74;
      if (0xb < (int)uVar3) {
        uVar87 = uVar69 + 3;
        if (-1 < (int)uVar69) {
          uVar87 = uVar69;
        }
        uVar82 = 0;
        do {
          fVar116 = fVar100;
          fVar92 = fVar100;
          fVar96 = fVar100;
          fVar97 = fVar100;
          fVar98 = fVar100;
          fVar99 = fVar100;
          fVar93 = fVar100;
          fVar94 = fVar100;
          fVar95 = fVar100;
          fVar101 = fVar100;
          fVar102 = fVar100;
          fVar103 = fVar100;
          if (0 < iVar88) {
            pfVar75 = (float *)((uVar82 / 0xc) * local_f8.cstep *
                                CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                               (long)local_f8.data);
            lVar70 = 0;
            do {
              fVar104 = *(float *)((long)kernel->data +
                                  lVar70 * 4 +
                                  kernel->cstep *
                                  (long)(int)(((int)uVar87 >> 2) + (uVar69 - (uVar87 & 0xfffffffc)))
                                  * kernel->elemsize);
              fVar95 = fVar95 + *pfVar75 * fVar104;
              fVar101 = fVar101 + pfVar75[1] * fVar104;
              fVar102 = fVar102 + pfVar75[2] * fVar104;
              fVar103 = fVar103 + pfVar75[3] * fVar104;
              fVar98 = fVar98 + pfVar75[4] * fVar104;
              fVar99 = fVar99 + pfVar75[5] * fVar104;
              fVar93 = fVar93 + pfVar75[6] * fVar104;
              fVar94 = fVar94 + pfVar75[7] * fVar104;
              fVar116 = fVar116 + fVar104 * pfVar75[8];
              fVar92 = fVar92 + fVar104 * pfVar75[9];
              fVar96 = fVar96 + fVar104 * pfVar75[10];
              fVar97 = fVar97 + fVar104 * pfVar75[0xb];
              lVar70 = lVar70 + 1;
              pfVar75 = pfVar75 + 0xc;
            } while (iVar88 != (int)lVar70);
          }
          *pfVar86 = fVar95;
          pfVar86[1] = fVar101;
          pfVar86[2] = fVar102;
          pfVar86[3] = fVar103;
          pfVar86[4] = fVar98;
          pfVar86[5] = fVar99;
          pfVar86[6] = fVar93;
          pfVar86[7] = fVar94;
          pfVar86[8] = fVar116;
          pfVar86[9] = fVar92;
          pfVar86[10] = fVar96;
          pfVar86[0xb] = fVar97;
          pfVar86 = pfVar86 + 0xc;
          uVar76 = uVar82 + 0xc;
          iVar72 = (int)uVar82;
          uVar82 = uVar76;
        } while (iVar72 + 0x17 < (int)uVar3);
      }
      if ((int)uVar76 + 7 < (int)uVar3) {
        uVar87 = uVar69 + 3;
        if (-1 < (int)uVar69) {
          uVar87 = uVar69;
        }
        do {
          iVar72 = (int)uVar76;
          fVar116 = fVar100;
          fVar92 = fVar100;
          fVar96 = fVar100;
          fVar97 = fVar100;
          fVar98 = fVar100;
          fVar99 = fVar100;
          fVar93 = fVar100;
          fVar94 = fVar100;
          if (0 < (int)local_68) {
            pfVar75 = (float *)((((uint)(iVar72 + (int)((uVar76 & 0xffffffff) / 0xc) * -0xc) >> 3) +
                                (int)((uVar76 & 0xffffffff) / 0xc)) * local_f8.cstep *
                                CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                               (long)local_f8.data);
            lVar70 = 0;
            do {
              fVar95 = *(float *)((long)kernel->data +
                                 lVar70 * 4 +
                                 kernel->cstep *
                                 (long)(int)(((int)uVar87 >> 2) + (uVar69 - (uVar87 & 0xfffffffc)))
                                 * kernel->elemsize);
              fVar98 = fVar98 + *pfVar75 * fVar95;
              fVar99 = fVar99 + pfVar75[1] * fVar95;
              fVar93 = fVar93 + pfVar75[2] * fVar95;
              fVar94 = fVar94 + pfVar75[3] * fVar95;
              fVar116 = fVar116 + fVar95 * pfVar75[4];
              fVar92 = fVar92 + fVar95 * pfVar75[5];
              fVar96 = fVar96 + fVar95 * pfVar75[6];
              fVar97 = fVar97 + fVar95 * pfVar75[7];
              lVar70 = lVar70 + 1;
              pfVar75 = pfVar75 + 8;
            } while (iVar88 != (int)lVar70);
          }
          *pfVar86 = fVar98;
          pfVar86[1] = fVar99;
          pfVar86[2] = fVar93;
          pfVar86[3] = fVar94;
          pfVar86[4] = fVar116;
          pfVar86[5] = fVar92;
          pfVar86[6] = fVar96;
          pfVar86[7] = fVar97;
          pfVar86 = pfVar86 + 8;
          uVar76 = (ulong)(iVar72 + 8);
        } while (iVar72 + 0xf < (int)uVar3);
      }
      else {
        uVar76 = uVar76 & 0xffffffff;
      }
      uVar87 = (uint)uVar76;
      if ((int)(uVar87 | 3) < (int)uVar3) {
        uVar73 = uVar69 + 3;
        if (-1 < (int)uVar69) {
          uVar73 = uVar69;
        }
        do {
          iVar72 = (int)uVar76;
          fVar116 = fVar100;
          fVar92 = fVar100;
          fVar96 = fVar100;
          fVar97 = fVar100;
          if (0 < (int)local_a8 * iVar4 * 4) {
            uVar87 = iVar72 + (int)(uVar76 / 0xc) * -0xc;
            pfVar75 = (float *)(((uVar87 >> 3) + (int)(uVar76 / 0xc) +
                                (uint)((uVar87 >> 2 & 1) != 0)) * local_f8.cstep *
                                CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                               (long)local_f8.data);
            lVar70 = 0;
            do {
              fVar98 = *(float *)((long)kernel->data +
                                 lVar70 * 4 +
                                 kernel->cstep *
                                 (long)(int)(((int)uVar73 >> 2) + (uVar69 - (uVar73 & 0xfffffffc)))
                                 * kernel->elemsize);
              fVar116 = fVar116 + fVar98 * *pfVar75;
              fVar92 = fVar92 + fVar98 * pfVar75[1];
              fVar96 = fVar96 + fVar98 * pfVar75[2];
              fVar97 = fVar97 + fVar98 * pfVar75[3];
              pfVar75 = pfVar75 + 4;
              lVar70 = lVar70 + 1;
            } while (iVar88 != (int)lVar70);
          }
          *pfVar86 = fVar116;
          pfVar86[1] = fVar92;
          pfVar86[2] = fVar96;
          pfVar86[3] = fVar97;
          pfVar86 = pfVar86 + 4;
          uVar87 = iVar72 + 4;
          uVar76 = (ulong)uVar87;
        } while (iVar72 + 7 < (int)uVar3);
      }
      if ((int)uVar87 < (int)uVar3) {
        uVar73 = uVar69 + 3;
        if (-1 < (int)uVar69) {
          uVar73 = uVar69;
        }
        sVar5 = kernel->cstep;
        sVar7 = kernel->elemsize;
        pvVar6 = kernel->data;
        do {
          if ((int)local_a8 * iVar4 < 1) {
            fVar116 = 0.0;
            fVar92 = 0.0;
            fVar96 = 0.0;
            fVar97 = 0.0;
          }
          else {
            fVar116 = 0.0;
            fVar92 = 0.0;
            fVar96 = 0.0;
            fVar97 = 0.0;
            lVar70 = 0;
            uVar76 = local_78;
            do {
              pfVar75 = (float *)((long)pvVar6 +
                                 lVar70 + (long)(int)(((int)uVar73 >> 2) +
                                                     (uVar69 - (uVar73 & 0xfffffffc))) * sVar5 *
                                          sVar7);
              pfVar77 = (float *)((long)local_f8.data +
                                 lVar70 + (ulong)((uVar87 & 3) + (uVar87 % 0xc >> 3) + uVar87 / 0xc
                                                 + (uint)((uVar87 % 0xc >> 2 & 1) != 0)) *
                                          local_f8.cstep *
                                          CONCAT44(local_f8.elemsize._4_4_,
                                                   (undefined4)local_f8.elemsize));
              fVar116 = fVar116 + *pfVar75 * *pfVar77;
              fVar92 = fVar92 + pfVar75[1] * pfVar77[1];
              fVar96 = fVar96 + pfVar75[2] * pfVar77[2];
              fVar97 = fVar97 + pfVar75[3] * pfVar77[3];
              lVar70 = lVar70 + 0x10;
              uVar83 = (int)uVar76 - 1;
              uVar76 = (ulong)uVar83;
            } while (uVar83 != 0);
          }
          *pfVar86 = fVar97 + fVar92 + fVar100 + fVar96 + fVar116;
          pfVar86 = pfVar86 + 1;
          uVar87 = uVar87 + 1;
        } while (uVar87 != uVar3);
      }
      lVar74 = lVar74 + 1;
    } while (lVar74 != local_90);
  }
  piVar67 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar67 != (int *)0x0) {
    LOCK();
    *piVar67 = *piVar67 + -1;
    UNLOCK();
    if (*piVar67 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to1_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u * 4, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    Mat tmp;
    if (size >= 12)
        tmp.create(12 * maxk, inch, size / 12 + (size % 12) / 8 + (size % 12 % 8) / 4 + size % 12 % 4, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u * 4, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u * 4, 4, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size / 12;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 12;

            float* tmpptr = tmp.channel(i / 12);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x12
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _r1);
                    _mm_store_ps(tmpptr + 4 * 4, _r5);
                    _mm_store_ps(tmpptr + 4 * 5, _r9);
                    _mm_store_ps(tmpptr + 4 * 6, _r2);
                    _mm_store_ps(tmpptr + 4 * 7, _r6);
                    _mm_store_ps(tmpptr + 4 * 8, _ra);
                    _mm_store_ps(tmpptr + 4 * 9, _r3);
                    _mm_store_ps(tmpptr + 4 * 10, _r7);
                    _mm_store_ps(tmpptr + 4 * 11, _rb);

                    img0 += size * 4;
                    tmpptr += 48;
                }
            }
        }

        remain_size_start += nn_size * 12;
        nn_size = (size - remain_size_start) >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x4
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 2, _r2);
                    _mm_store_ps(tmpptr + 4 * 3, _r3);

                    img0 += size * 4;
                    tmpptr += 16;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + i % 12 % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    int nn_outch = outch / 4;
    int remain_outch_start = nn_outch * 4;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);
        float* outptr2 = top_blob.channel(p + 2);
        float* outptr3 = top_blob.channel(p + 3);

        const float zeros[4] = {0.f};
        const float* biasptr = bias ? bias + p : zeros;

        int i = 0;
        for (; i + 11 < size; i += 12)
        {
            const float* tmpptr = tmp.channel(i / 12);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_load1_ps(biasptr);
            __m128 _sum1 = _mm_load1_ps(biasptr);
            __m128 _sum2 = _mm_load1_ps(biasptr);
            __m128 _sum3 = _mm_load1_ps(biasptr + 1);
            __m128 _sum4 = _mm_load1_ps(biasptr + 1);
            __m128 _sum5 = _mm_load1_ps(biasptr + 1);
            __m128 _sum6 = _mm_load1_ps(biasptr + 2);
            __m128 _sum7 = _mm_load1_ps(biasptr + 2);
            __m128 _sum8 = _mm_load1_ps(biasptr + 2);
            __m128 _sum9 = _mm_load1_ps(biasptr + 3);
            __m128 _suma = _mm_load1_ps(biasptr + 3);
            __m128 _sumb = _mm_load1_ps(biasptr + 3);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);
                __m128 _val2 = _mm_load_ps(tmpptr + 8);

                __m128 _w0 = _mm_load1_ps(kptr0);
                __m128 _w1 = _mm_load1_ps(kptr0 + 1);
                __m128 _w2 = _mm_load1_ps(kptr0 + 2);
                __m128 _w3 = _mm_load1_ps(kptr0 + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val0, _w1, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val1, _w1, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val2, _w1, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val0, _w2, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val1, _w2, _sum7);
                _sum8 = _mm_comp_fmadd_ps(_val2, _w2, _sum8);
                _sum9 = _mm_comp_fmadd_ps(_val0, _w3, _sum9);
                _suma = _mm_comp_fmadd_ps(_val1, _w3, _suma);
                _sumb = _mm_comp_fmadd_ps(_val2, _w3, _sumb);

                tmpptr += 12;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr1, _sum3);
            _mm_store_ps(outptr1 + 4, _sum4);
            _mm_store_ps(outptr1 + 8, _sum5);
            _mm_store_ps(outptr2, _sum6);
            _mm_store_ps(outptr2 + 4, _sum7);
            _mm_store_ps(outptr2 + 8, _sum8);
            _mm_store_ps(outptr3, _sum9);
            _mm_store_ps(outptr3 + 4, _suma);
            _mm_store_ps(outptr3 + 8, _sumb);

            outptr0 += 12;
            outptr1 += 12;
            outptr2 += 12;
            outptr3 += 12;
        }
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_load1_ps(biasptr);
            __m128 _sum1 = _mm_load1_ps(biasptr);
            __m128 _sum2 = _mm_load1_ps(biasptr + 1);
            __m128 _sum3 = _mm_load1_ps(biasptr + 1);
            __m128 _sum4 = _mm_load1_ps(biasptr + 2);
            __m128 _sum5 = _mm_load1_ps(biasptr + 2);
            __m128 _sum6 = _mm_load1_ps(biasptr + 3);
            __m128 _sum7 = _mm_load1_ps(biasptr + 3);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);

                __m128 _w0 = _mm_load1_ps(kptr0);
                __m128 _w1 = _mm_load1_ps(kptr0 + 1);
                __m128 _w2 = _mm_load1_ps(kptr0 + 2);
                __m128 _w3 = _mm_load1_ps(kptr0 + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val0, _w1, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val1, _w1, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val0, _w2, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val1, _w2, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val0, _w3, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val1, _w3, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr1, _sum2);
            _mm_store_ps(outptr1 + 4, _sum3);
            _mm_store_ps(outptr2, _sum4);
            _mm_store_ps(outptr2 + 4, _sum5);
            _mm_store_ps(outptr3, _sum6);
            _mm_store_ps(outptr3 + 4, _sum7);

            outptr0 += 8;
            outptr1 += 8;
            outptr2 += 8;
            outptr3 += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_load1_ps(biasptr);
            __m128 _sum1 = _mm_load1_ps(biasptr + 1);
            __m128 _sum2 = _mm_load1_ps(biasptr + 2);
            __m128 _sum3 = _mm_load1_ps(biasptr + 3);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);

                __m128 _w0 = _mm_load1_ps(kptr0);
                __m128 _w1 = _mm_load1_ps(kptr0 + 1);
                __m128 _w2 = _mm_load1_ps(kptr0 + 2);
                __m128 _w3 = _mm_load1_ps(kptr0 + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val0, _w1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val0, _w2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val0, _w3, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr1, _sum1);
            _mm_store_ps(outptr2, _sum2);
            _mm_store_ps(outptr3, _sum3);

            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + i % 12 % 4);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _w0 = _mm_load_ps(kptr0);
                _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            float sum[4];
            _mm_storeu_ps(sum, _sum);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];

            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        int i = 0;
        for (; i + 11 < size; i += 12)
        {
            const float* tmpptr = tmp.channel(i / 12);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_set1_ps(bias0);
            __m128 _sum1 = _mm_set1_ps(bias0);
            __m128 _sum2 = _mm_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);
                __m128 _val2 = _mm_load_ps(tmpptr + 8);
                __m128 _w0 = _mm_load1_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_w0, _val2, _sum2);

                tmpptr += 12;
                kptr0 += 1;
            }

            _mm_storeu_ps(outptr0, _sum0);
            _mm_storeu_ps(outptr0 + 4, _sum1);
            _mm_storeu_ps(outptr0 + 8, _sum2);

            outptr0 += 12;
        }
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_set1_ps(bias0);
            __m128 _sum1 = _mm_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);
                __m128 _w0 = _mm_load1_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val1, _sum1);

                tmpptr += 8;
                kptr0 += 1;
            }

            _mm_storeu_ps(outptr0, _sum0);
            _mm_storeu_ps(outptr0 + 4, _sum1);

            outptr0 += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _w0 = _mm_load1_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);

                tmpptr += 4;
                kptr0 += 1;
            }

            _mm_storeu_ps(outptr0, _sum0);

            outptr0 += 4;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + i % 12 % 4);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            float sum0 = bias0;

            __m128 _sum0 = _mm_setzero_ps();

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _w0 = _mm_load_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);

                tmpptr += 4;
                kptr0 += 4;
            }

            sum0 += _mm_reduce_add_ps(_sum0);

            outptr0[0] = sum0;

            outptr0 += 1;
        }
    }
}